

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O0

error try_reuse(context *ctx,token *token,opcode *op,int address)

{
  int iVar1;
  undefined4 in_register_0000000c;
  int in_R8D;
  token local_58;
  int local_2c;
  opcode *poStack_28;
  int address_local;
  opcode *op_local;
  token *token_local;
  context *ctx_local;
  
  poStack_28 = (opcode *)CONCAT44(in_register_0000000c,address);
  local_2c = in_R8D;
  op_local = op;
  token_local = token;
  ctx_local = ctx;
  iVar1 = equal((token *)op,".reuse");
  if (iVar1 == 0) {
    memset(ctx,0,8);
    error::error((error *)ctx);
  }
  else {
    if (local_2c == 8) {
      opcode::add_reuse(poStack_28,1);
    }
    else if (local_2c == 0x14) {
      opcode::add_reuse(poStack_28,2);
    }
    else {
      if (local_2c != 0x27) {
        fail((token *)ctx,(char *)op_local,"register cannot be reused");
        return (unique_ptr<char[],_std::default_delete<char[]>_>)
               (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
      }
      opcode::add_reuse(poStack_28,4);
    }
    context::tokenize(&local_58,(context *)token_local);
    memcpy(op_local,&local_58,0x24);
    memset(ctx,0,8);
    error::error((error *)ctx);
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

error try_reuse(context& ctx, token& token, opcode& op, int address)
{
    if (!equal(token, ".reuse")) {
        return {};
    }
    switch (address) {
    case 8:
        op.add_reuse(reuse_flag::gpr8);
        break;
    case 20:
        op.add_reuse(reuse_flag::gpr20);
        break;
    case 39:
        op.add_reuse(reuse_flag::gpr39);
        break;
    default:
        return fail(token, "register cannot be reused");
    }

    token = ctx.tokenize();
    return {};
}